

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.h
# Opt level: O2

shared_ptr<ListNodes<int_*>_> __thiscall Lists<int_*>::last(Lists<int_*> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<ListNodes<int_*>_> sVar1;
  
  std::__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x10));
  sVar1.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ListNodes<int_*>_>)
         sVar1.super___shared_ptr<ListNodes<int_*>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ListNodes<T>> last() {
        return theLast;
    }